

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_dc_predictor_8x16_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  
  lVar12 = 0;
  iVar13 = 0;
  iVar14 = 0;
  iVar15 = 0;
  iVar16 = 0;
  do {
    uVar1 = *(undefined4 *)(above + lVar12);
    uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar8;
    auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar3[8] = (char)((uint)uVar1 >> 0x10);
    auVar3._0_8_ = uVar8;
    auVar3[9] = 0;
    auVar3._10_3_ = auVar2._10_3_;
    auVar9._5_8_ = 0;
    auVar9._0_5_ = auVar3._8_5_;
    auVar4[4] = (char)((uint)uVar1 >> 8);
    auVar4._0_4_ = (int)uVar8;
    auVar4[5] = 0;
    auVar4._6_7_ = SUB137(auVar9 << 0x40,6);
    iVar13 = iVar13 + (int)uVar8;
    iVar14 = iVar14 + auVar4._4_4_;
    iVar15 = iVar15 + auVar3._8_4_;
    iVar16 = iVar16 + (uint)(uint3)(auVar2._10_3_ >> 0x10);
    lVar12 = lVar12 + 4;
  } while (lVar12 != 8);
  iVar13 = iVar16 + iVar14 + iVar15 + iVar13;
  iVar14 = 0;
  iVar15 = 0;
  iVar16 = 0;
  lVar12 = 0;
  do {
    uVar1 = *(undefined4 *)(left + lVar12);
    uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar8;
    auVar5[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar6[8] = (char)((uint)uVar1 >> 0x10);
    auVar6._0_8_ = uVar8;
    auVar6[9] = 0;
    auVar6._10_3_ = auVar5._10_3_;
    auVar10._5_8_ = 0;
    auVar10._0_5_ = auVar6._8_5_;
    auVar7[4] = (char)((uint)uVar1 >> 8);
    auVar7._0_4_ = (int)uVar8;
    auVar7[5] = 0;
    auVar7._6_7_ = SUB137(auVar10 << 0x40,6);
    iVar13 = iVar13 + (int)uVar8;
    iVar14 = iVar14 + auVar7._4_4_;
    iVar15 = iVar15 + auVar6._8_4_;
    iVar16 = iVar16 + (uint)(uint3)(auVar5._10_3_ >> 0x10);
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x10);
  iVar11 = 0x10;
  do {
    *(ulong *)dst =
         (ulong)((iVar16 + iVar14 + iVar15 + iVar13 + 0xcU >> 3) * 0x5556 >> 0x10 & 0xff) *
         0x101010101010101;
    dst = (uint8_t *)((long)dst + stride);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  return;
}

Assistant:

void aom_dc_predictor_8x16_c(uint8_t *dst, ptrdiff_t stride,
                             const uint8_t *above, const uint8_t *left) {
  dc_predictor_rect(dst, stride, 8, 16, above, left, 3, DC_MULTIPLIER_1X2);
}